

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timDump.c
# Opt level: O0

Vec_Str_t * Tim_ManSave(Tim_Man_t *p,int fHieOnly)

{
  float fVar1;
  int iVar2;
  Vec_Str_t *vOut;
  int *piVar3;
  float *pfVar4;
  bool bVar5;
  float fVar6;
  int local_48;
  int TableSize;
  int k;
  int i;
  float *pDelayTable;
  Vec_Str_t *vStr;
  Tim_Obj_t *pObj;
  Tim_Box_t *pBox;
  int fHieOnly_local;
  Tim_Man_t *p_local;
  
  vOut = Vec_StrAlloc(10000);
  Vec_StrPutI_ne(vOut,1);
  iVar2 = Tim_ManCiNum(p);
  Vec_StrPutI_ne(vOut,iVar2);
  iVar2 = Tim_ManCoNum(p);
  Vec_StrPutI_ne(vOut,iVar2);
  iVar2 = Tim_ManPiNum(p);
  Vec_StrPutI_ne(vOut,iVar2);
  iVar2 = Tim_ManPoNum(p);
  Vec_StrPutI_ne(vOut,iVar2);
  iVar2 = Tim_ManBoxNum(p);
  Vec_StrPutI_ne(vOut,iVar2);
  iVar2 = Tim_ManBoxNum(p);
  if (0 < iVar2) {
    for (TableSize = 0; iVar2 = Vec_PtrSize(p->vBoxes), TableSize < iVar2; TableSize = TableSize + 1
        ) {
      piVar3 = (int *)Vec_PtrEntry(p->vBoxes,TableSize);
      iVar2 = Tim_ManBoxInputNum(p,*piVar3);
      Vec_StrPutI_ne(vOut,iVar2);
      iVar2 = Tim_ManBoxOutputNum(p,*piVar3);
      Vec_StrPutI_ne(vOut,iVar2);
      iVar2 = Tim_ManBoxDelayTableId(p,*piVar3);
      Vec_StrPutI_ne(vOut,iVar2);
      iVar2 = Tim_ManBoxCopy(p,*piVar3);
      Vec_StrPutI_ne(vOut,iVar2);
    }
  }
  if (fHieOnly == 0) {
    iVar2 = Tim_ManDelayTableNum(p);
    Vec_StrPutI_ne(vOut,iVar2);
    iVar2 = Tim_ManDelayTableNum(p);
    if (0 < iVar2) {
      for (TableSize = 0; iVar2 = Vec_PtrSize(p->vDelayTables), TableSize < iVar2;
          TableSize = TableSize + 1) {
        pfVar4 = (float *)Vec_PtrEntry(p->vDelayTables,TableSize);
        if ((int)*pfVar4 != TableSize) {
          __assert_fail("(int)pDelayTable[0] == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timDump.c"
                        ,0x53,"Vec_Str_t *Tim_ManSave(Tim_Man_t *, int)");
        }
        Vec_StrPutI_ne(vOut,(int)*pfVar4);
        Vec_StrPutI_ne(vOut,(int)pfVar4[1]);
        Vec_StrPutI_ne(vOut,(int)pfVar4[2]);
        fVar6 = pfVar4[1];
        fVar1 = pfVar4[2];
        for (local_48 = 0; local_48 < (int)fVar6 * (int)fVar1; local_48 = local_48 + 1) {
          Vec_StrPutF(vOut,pfVar4[local_48 + 3]);
        }
      }
    }
    TableSize = 0;
    while( true ) {
      bVar5 = false;
      if (TableSize < p->nCis) {
        vStr = (Vec_Str_t *)(p->pCis + TableSize);
        bVar5 = (Tim_Obj_t *)vStr != (Tim_Obj_t *)0x0;
      }
      if (!bVar5) break;
      if (*(int *)&vStr->pArray < 0) {
        fVar6 = Tim_ManGetCiArrival(p,vStr->nCap);
        Vec_StrPutF(vOut,fVar6);
      }
      TableSize = TableSize + 1;
    }
    TableSize = 0;
    while( true ) {
      bVar5 = false;
      if (TableSize < p->nCos) {
        vStr = (Vec_Str_t *)(p->pCos + TableSize);
        bVar5 = (Tim_Obj_t *)vStr != (Tim_Obj_t *)0x0;
      }
      if (!bVar5) break;
      if (*(int *)&vStr->pArray < 0) {
        fVar6 = Tim_ManGetCoRequired(p,vStr->nCap);
        Vec_StrPutF(vOut,fVar6);
      }
      TableSize = TableSize + 1;
    }
  }
  return vOut;
}

Assistant:

Vec_Str_t * Tim_ManSave( Tim_Man_t * p, int fHieOnly )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    Vec_Str_t * vStr;
    float * pDelayTable;
    int i, k, TableSize;
    // create output stream
    vStr = Vec_StrAlloc( 10000 );
    // dump version number
    Vec_StrPutI_ne( vStr, TIM_DUMP_VER_NUM );
    // save CI/CO counts
    Vec_StrPutI_ne( vStr, Tim_ManCiNum(p) );
    Vec_StrPutI_ne( vStr, Tim_ManCoNum(p) );
    // save PI/PO counts
    Vec_StrPutI_ne( vStr, Tim_ManPiNum(p) );
    Vec_StrPutI_ne( vStr, Tim_ManPoNum(p) );
    // save number of boxes
    Vec_StrPutI_ne( vStr, Tim_ManBoxNum(p) );
    // for each box, save num_inputs, num_outputs, delay table ID, and copy field
    if ( Tim_ManBoxNum(p) > 0 )
    Tim_ManForEachBox( p, pBox, i )
    {
        Vec_StrPutI_ne( vStr, Tim_ManBoxInputNum(p, pBox->iBox) );
        Vec_StrPutI_ne( vStr, Tim_ManBoxOutputNum(p, pBox->iBox) );
        Vec_StrPutI_ne( vStr, Tim_ManBoxDelayTableId(p, pBox->iBox) ); // can be -1 if delay table is not given
        Vec_StrPutI_ne( vStr, Tim_ManBoxCopy(p, pBox->iBox) );         // can be -1 if the copy is node defined
        //Vec_StrPutI_ne( vStr, Tim_ManBoxIsBlack(p, pBox->iBox) );
    }
    if ( fHieOnly )
        return vStr;
    // save the number of delay tables
    Vec_StrPutI_ne( vStr, Tim_ManDelayTableNum(p) );
    // save the delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    Tim_ManForEachTable( p, pDelayTable, i )
    {
        assert( (int)pDelayTable[0] == i );
        // save table ID and dimensions (inputs x outputs)
        Vec_StrPutI_ne( vStr, (int)pDelayTable[0] );
        Vec_StrPutI_ne( vStr, (int)pDelayTable[1] );
        Vec_StrPutI_ne( vStr, (int)pDelayTable[2] );
        // save table contents
        TableSize = (int)pDelayTable[1] * (int)pDelayTable[2];
        for ( k = 0; k < TableSize; k++ )
            Vec_StrPutF( vStr, pDelayTable[k+3] );
    }
    // save PI arrival times
    Tim_ManForEachPi( p, pObj, i )
        Vec_StrPutF( vStr, Tim_ManGetCiArrival(p, pObj->Id) );
    // save PO required times
    Tim_ManForEachPo( p, pObj, i )
        Vec_StrPutF( vStr, Tim_ManGetCoRequired(p, pObj->Id) );
    return vStr;
}